

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O3

int __thiscall ReadData::decode(ReadData *this,FILE *file)

{
  int iVar1;
  long *plVar2;
  uchar HeadBuff [25];
  uchar auStack_38 [32];
  
  iVar1 = ReadHead(this,file,auStack_38);
  if (iVar1 == 0) {
    iVar1 = ReadMessage(this,file,auStack_38);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"error happened with code ",0x19);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
  }
  return iVar1;
}

Assistant:

int ReadData::decode(FILE* file) {
    int flag;
    unsigned char HeadBuff[25];
    flag = ReadHead(file, HeadBuff);
    if(flag != 0) {
        cout << "error happened with code " << flag << endl;
        return flag;
    }
    flag = ReadMessage(file, HeadBuff);

    // find neither eph nor obs
    return flag;
}